

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O2

void EvaluateNode(size_t block_start,size_t pos,size_t max_backward_limit,size_t gap,
                 int *starting_dist_cache,ZopfliCostModel *model,StartPosQueue *queue,
                 ZopfliNode *nodes)

{
  size_t *psVar1;
  float *pfVar2;
  uint uVar3;
  uint32_t uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 *puVar18;
  ulong uVar19;
  undefined8 *puVar20;
  uint uVar21;
  float fVar22;
  uint32_t local_58 [2];
  size_t sStack_50;
  PosData posdata;
  
  posdata.distance_cache[1] = (int)nodes[pos].u.cost;
  if (pos == 0) {
    uVar15 = 0;
  }
  else {
    uVar13 = nodes[pos].distance;
    uVar21 = nodes[pos].length & 0x1ffffff;
    uVar3 = nodes[pos].dcode_insert_length;
    if (((ulong)uVar13 <= max_backward_limit + gap) &&
       ((ulong)uVar13 + (ulong)uVar21 <= block_start + pos + gap)) {
      iVar12 = (uVar3 >> 0x1b) - 1;
      if (uVar3 < 0x8000000) {
        iVar12 = uVar13 + 0xf;
      }
      if (iVar12 != 0) {
        uVar15 = pos & 0xffffffff;
        goto LAB_01e57b1d;
      }
    }
    uVar15 = (ulong)nodes[pos - ((uVar3 & 0x7ffffff) + uVar21)].u.next;
  }
LAB_01e57b1d:
  nodes[pos].u.next = (uint32_t)uVar15;
  fVar22 = model->literal_costs_[pos] - *model->literal_costs_;
  if ((float)posdata.distance_cache[1] <= fVar22) {
    posdata.distance_cache[0] = (int)((float)posdata.distance_cache[1] - fVar22);
    lVar14 = 2;
    for (; (lVar14 - 2U < 4 && ((int)uVar15 != 0));
        uVar15 = (ulong)nodes[uVar15 - ((uVar3 & 0x1ffffff) + (uVar13 & 0x7ffffff))].u.next) {
      uVar13 = nodes[uVar15].dcode_insert_length;
      uVar3 = nodes[uVar15].length;
      local_58[lVar14] = nodes[uVar15].distance;
      lVar14 = lVar14 + 1;
    }
    for (; lVar14 != 6; lVar14 = lVar14 + 1) {
      uVar4 = *starting_dist_cache;
      starting_dist_cache = (int *)((uint32_t *)starting_dist_cache + 1);
      local_58[lVar14] = uVar4;
    }
    uVar16 = queue->idx_ + 1;
    uVar13 = ~(uint)queue->idx_ & 7;
    uVar15 = 8;
    if (uVar16 < 8) {
      uVar15 = uVar16;
    }
    queue->idx_ = uVar16;
    psVar1 = (size_t *)((long)queue->q_[0].distance_cache + (ulong)(uVar13 << 5) + 8);
    *psVar1 = posdata.pos;
    psVar1[1] = CONCAT44(posdata.distance_cache[1],posdata.distance_cache[0]);
    psVar1 = (size_t *)((long)queue->q_[0].distance_cache + ((ulong)(uVar13 << 5) - 8));
    *psVar1 = pos;
    psVar1[1] = sStack_50;
    for (uVar16 = 1; uVar16 < uVar15; uVar16 = uVar16 + 1) {
      uVar17 = (ulong)(((uVar13 + (int)uVar16) - 1 & 7) << 5);
      fVar22 = *(float *)((long)queue->q_[0].distance_cache + uVar17 + 0x10);
      uVar19 = (ulong)((uVar13 + (int)uVar16 & 7) << 5);
      pfVar2 = (float *)((long)queue->q_[0].distance_cache + uVar19 + 0x10);
      if (*pfVar2 <= fVar22 && fVar22 != *pfVar2) {
        puVar18 = (undefined8 *)((long)queue->q_[0].distance_cache + (uVar17 - 8));
        puVar20 = (undefined8 *)((long)queue->q_[0].distance_cache + (uVar19 - 8));
        uVar5 = *puVar18;
        uVar6 = puVar18[1];
        uVar7 = puVar18[2];
        uVar8 = puVar18[3];
        uVar9 = *puVar20;
        uVar10 = puVar20[1];
        uVar11 = puVar20[3];
        puVar18[2] = puVar20[2];
        puVar18[3] = uVar11;
        *puVar18 = uVar9;
        puVar18[1] = uVar10;
        puVar20[2] = uVar7;
        puVar20[3] = uVar8;
        *puVar20 = uVar5;
        puVar20[1] = uVar6;
      }
    }
  }
  return;
}

Assistant:

static void EvaluateNode(
    const size_t block_start, const size_t pos, const size_t max_backward_limit,
    const size_t gap, const int* starting_dist_cache,
    const ZopfliCostModel* model, StartPosQueue* queue, ZopfliNode* nodes) {
  /* Save cost, because ComputeDistanceCache invalidates it. */
  float node_cost = nodes[pos].u.cost;
  nodes[pos].u.shortcut = ComputeDistanceShortcut(
      block_start, pos, max_backward_limit, gap, nodes);
  if (node_cost <= ZopfliCostModelGetLiteralCosts(model, 0, pos)) {
    PosData posdata;
    posdata.pos = pos;
    posdata.cost = node_cost;
    posdata.costdiff = node_cost -
        ZopfliCostModelGetLiteralCosts(model, 0, pos);
    ComputeDistanceCache(
        pos, starting_dist_cache, nodes, posdata.distance_cache);
    StartPosQueuePush(queue, &posdata);
  }
}